

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ncnnoptimize.cpp
# Opt level: O0

int __thiscall
NetOptimize::replace_convolution_with_innerproduct_after_global_pooling(NetOptimize *this)

{
  int iVar1;
  undefined4 uVar2;
  undefined3 uVar3;
  bool bVar4;
  size_type sVar5;
  reference ppLVar6;
  reference pvVar7;
  size_type sVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  Layer *pLVar11;
  long in_RDI;
  ParamDict pd;
  InnerProduct *innerproduct;
  Convolution *convolution;
  int j;
  int top_blob_index;
  Pooling *pooling;
  int i;
  size_t layer_count;
  char *in_stack_fffffffffffff678;
  Layer *in_stack_fffffffffffff680;
  value_type in_stack_fffffffffffff688;
  value_type pLVar12;
  FILE *__stream;
  ParamDict *in_stack_fffffffffffff6c0;
  undefined1 local_938 [80];
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff718;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff720;
  int local_28;
  int local_14;
  
  sVar5 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::size
                    ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40));
  local_14 = 0;
  do {
    if (sVar5 <= (ulong)(long)local_14) {
      return 0;
    }
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
               (long)local_14);
    bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffff680,in_stack_fffffffffffff678);
    if ((!bVar4) &&
       (ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_14),
       *(int *)((long)&(*ppLVar6)[1].type._M_string_length + 4) != 0)) {
      ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                           (long)local_14);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->tops,0);
      iVar1 = *pvVar7;
      local_28 = local_14;
      do {
        do {
          do {
            local_28 = local_28 + 1;
            if (sVar5 <= (ulong)(long)local_28) goto LAB_00121d05;
            std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                      ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x40),
                       (long)local_28);
            bVar4 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffff680,in_stack_fffffffffffff678);
          } while (bVar4);
          ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                              ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                               (in_RDI + 0x40),(long)local_28);
          sVar8 = std::vector<int,_std::allocator<int>_>::size(&(*ppLVar6)->bottoms);
        } while (sVar8 != 1);
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_28);
        pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&(*ppLVar6)->bottoms,0);
      } while (*pvVar7 != iVar1);
LAB_00121d05:
      if ((long)local_28 != sVar5) {
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_28);
        pLVar12 = *ppLVar6;
        __stream = _stderr;
        uVar9 = std::__cxx11::string::c_str();
        uVar10 = std::__cxx11::string::c_str();
        fprintf(__stream,"replace_convolution_with_innerproduct_after_global_pooling %s %s\n",uVar9,
                uVar10);
        pLVar11 = ncnn::create_layer(in_stack_fffffffffffff678);
        std::__cxx11::string::operator=((string *)&pLVar11->type,"InnerProduct");
        std::__cxx11::string::operator=((string *)&pLVar11->name,(string *)&pLVar12->name);
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        std::vector<int,_std::allocator<int>_>::operator=
                  (in_stack_fffffffffffff720,in_stack_fffffffffffff718);
        ncnn::ParamDict::ParamDict(in_stack_fffffffffffff6c0);
        (*pLVar11->_vptr_Layer[2])(pLVar11,local_938);
        *(undefined4 *)&pLVar11[1]._vptr_Layer = *(undefined4 *)&pLVar12[1]._vptr_Layer;
        *(undefined4 *)((long)&pLVar11[1]._vptr_Layer + 4) =
             *(undefined4 *)((long)&pLVar12[1].type.field_2 + 8);
        uVar2 = *(undefined4 *)((long)&pLVar12[1].type.field_2 + 0xc);
        pLVar11[1].one_blob_only = (bool)(char)uVar2;
        pLVar11[1].support_inplace = (bool)(char)((uint)uVar2 >> 8);
        pLVar11[1].support_vulkan = (bool)(char)((uint)uVar2 >> 0x10);
        pLVar11[1].support_packing = (bool)(char)((uint)uVar2 >> 0x18);
        uVar3 = *(undefined3 *)&pLVar12[1].name.field_0x1;
        pLVar11[1].support_bf16_storage = (bool)pLVar12[1].name._M_dataplus;
        *(undefined3 *)&pLVar11[1].field_0xd = uVar3;
        ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff688,(Mat *)in_stack_fffffffffffff680);
        ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff688,(Mat *)in_stack_fffffffffffff680);
        ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff688,(Mat *)in_stack_fffffffffffff680);
        *(undefined4 *)
         &pLVar11[2].bottoms.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish =
             *(undefined4 *)
              &pLVar12[2].bottom_shapes.super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>.
               _M_impl.super__Vector_impl_data._M_start;
        pLVar11[1].typeindex = *(int *)&pLVar12[1].name.field_0x4;
        ncnn::Mat::operator=((Mat *)in_stack_fffffffffffff688,(Mat *)in_stack_fffffffffffff680);
        ppLVar6 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                            ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)
                             (in_RDI + 0x40),(long)local_28);
        *ppLVar6 = pLVar11;
        in_stack_fffffffffffff680 = pLVar11;
        in_stack_fffffffffffff688 = pLVar12;
        if (pLVar12 != (value_type)0x0) {
          (*pLVar12->_vptr_Layer[1])();
          in_stack_fffffffffffff680 = pLVar11;
          in_stack_fffffffffffff688 = pLVar12;
        }
        ncnn::ParamDict::~ParamDict((ParamDict *)__stream);
      }
    }
    local_14 = local_14 + 1;
  } while( true );
}

Assistant:

int NetOptimize::replace_convolution_with_innerproduct_after_global_pooling()
{
    const size_t layer_count = layers.size();
    for (int i=0; i<layer_count; i++)
    {
        if (layers[i]->type != "Pooling")
            continue;

        ncnn::Pooling* pooling = (ncnn::Pooling*)layers[i];
        if (pooling->global_pooling == 0)
            continue;

        // Pooling - Convolution
        int top_blob_index = layers[i]->tops[0];

        int j = i + 1;
        for (; j<layer_count; j++)
        {
            if (layers[j]->type != "Convolution")
                continue;

            if (layers[j]->bottoms.size() != 1)
                continue;

            if (layers[j]->bottoms[0] == top_blob_index)
                break;
        }

        if (j == layer_count)
            continue;

        ncnn::Convolution* convolution = (ncnn::Convolution*)layers[j];

        fprintf(stderr, "replace_convolution_with_innerproduct_after_global_pooling %s %s\n", pooling->name.c_str(), convolution->name.c_str());

        ncnn::InnerProduct* innerproduct = (ncnn::InnerProduct*)ncnn::create_layer("InnerProduct");

        innerproduct->type = "InnerProduct";
        innerproduct->name = convolution->name;
        innerproduct->bottoms = convolution->bottoms;
        innerproduct->tops = convolution->tops;

        ncnn::ParamDict pd;
        innerproduct->load_param(pd);

        innerproduct->num_output = convolution->num_output;
        innerproduct->bias_term = convolution->bias_term;
        innerproduct->weight_data_size = convolution->weight_data_size;
        innerproduct->int8_scale_term = convolution->int8_scale_term;

        innerproduct->weight_data = convolution->weight_data;
        innerproduct->bias_data = convolution->bias_data;
        innerproduct->weight_data_int8_scales = convolution->weight_data_int8_scales;
        innerproduct->bottom_blob_int8_scale = convolution->bottom_blob_int8_scale;

        innerproduct->activation_type = convolution->activation_type;
        innerproduct->activation_params = convolution->activation_params;

        layers[j] = innerproduct;
        delete convolution;
    }

    return 0;
}